

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O3

bool __thiscall BamTools::ConvertTool::ConvertToolPrivate::Run(ConvertToolPrivate *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  char cVar3;
  bool bVar4;
  __type _Var5;
  int iVar6;
  string *psVar7;
  istream *piVar8;
  ostream *poVar9;
  long lVar10;
  char *pcVar11;
  code *pcVar12;
  ConvertSettings *pCVar13;
  BamMultiReader reader;
  string line;
  ofstream outFile;
  BamMultiReader local_3b0;
  BamRegion local_3a8;
  BamAlignment local_390;
  undefined1 local_238 [32];
  byte abStack_218 [216];
  ios_base local_140 [272];
  
  pCVar13 = this->m_settings;
  if ((pCVar13->HasInput == false) && (pCVar13->HasInputFilelist == false)) {
    psVar7 = Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pCVar13->InputFiles,psVar7);
    pCVar13 = this->m_settings;
  }
  if (pCVar13->HasInputFilelist == true) {
    std::ifstream::ifstream((istream *)local_238,(pCVar13->InputFilelist)._M_dataplus._M_p,_S_in);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "bamtools convert ERROR: could not open input BAM file list... Aborting.",0x47);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      std::ifstream::~ifstream(local_238);
      return false;
    }
    paVar1 = &local_390.Name.field_2;
    local_390.Name._M_string_length = 0;
    local_390.Name.field_2._M_local_buf[0] = '\0';
    local_390.Name._M_dataplus._M_p = (pointer)paVar1;
    while( true ) {
      cVar3 = std::ios::widen((char)(((pointer)(local_238._0_8_ + -0x28))->RefName).field_2.
                                    _M_allocated_capacity + (char)(istream *)local_238);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_390,cVar3);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_settings->InputFiles,&local_390.Name);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_390.Name._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(local_238);
  }
  BamMultiReader::BamMultiReader(&local_3b0);
  bVar4 = BamMultiReader::Open(&local_3b0,&this->m_settings->InputFiles);
  if (bVar4) {
    if ((this->m_settings->HasInput == true) && (this->m_settings->HasRegion == true)) {
      local_238._0_4_ = 1;
      bVar4 = BamMultiReader::LocateIndexes(&local_3b0,(IndexType *)local_238);
      if (!bVar4) {
        lVar10 = 0x43;
        pcVar11 = "bamtools convert ERROR: could not locate index file(s)... Aborting.";
        goto LAB_00110b6d;
      }
    }
    BamMultiReader::GetReferenceData((RefVector *)local_238,&local_3b0);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator=
              (&this->m_references,
               (vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)local_238);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector
              ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)local_238);
    local_3a8.LeftRefID = -1;
    local_3a8.LeftPosition = -1;
    local_3a8.RightRefID = -1;
    local_3a8.RightPosition = -1;
    if (this->m_settings->HasRegion != true) {
LAB_00110aa2:
      std::ofstream::ofstream(local_238);
      pCVar13 = this->m_settings;
      if (pCVar13->HasOutput == true) {
        std::ofstream::open(local_238,(_Ios_Openmode)(pCVar13->OutputFilename)._M_dataplus._M_p);
        if ((abStack_218
             [(((pointer)(local_238._0_8_ + -0x28))->RefName).field_2._M_allocated_capacity] & 5) ==
            0) {
          std::ios::rdbuf((streambuf *)(&this->m_out + *(long *)(*(long *)&this->m_out + -0x18)));
          pCVar13 = this->m_settings;
          goto LAB_00110c4b;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"bamtools convert ERROR: could not open ",0x27);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,
                            (this->m_settings->OutputFilename)._M_dataplus._M_p,
                            (this->m_settings->OutputFilename)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," for output",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        bVar4 = false;
      }
      else {
LAB_00110c4b:
        psVar7 = &pCVar13->Format;
        sVar2 = (pCVar13->Format)._M_string_length;
        if ((sVar2 == DAT_001b2918) &&
           ((sVar2 == 0 ||
            (iVar6 = bcmp((psVar7->_M_dataplus)._M_p,FORMAT_PILEUP_abi_cxx11_,sVar2), iVar6 == 0))))
        {
          bVar4 = RunPileupConversion(this,&local_3b0);
        }
        else {
          if ((((sVar2 != DAT_001b2878) ||
               ((pcVar12 = PrintBed, sVar2 != 0 &&
                (iVar6 = bcmp((psVar7->_M_dataplus)._M_p,FORMAT_BED_abi_cxx11_,sVar2), iVar6 != 0)))
               ) && ((sVar2 != DAT_001b2898 ||
                     ((pcVar12 = PrintFasta, sVar2 != 0 &&
                      (iVar6 = bcmp((psVar7->_M_dataplus)._M_p,FORMAT_FASTA_abi_cxx11_,sVar2),
                      iVar6 != 0)))))) &&
             ((sVar2 != DAT_001b28b8 ||
              ((pcVar12 = PrintFastq, sVar2 != 0 &&
               (iVar6 = bcmp((psVar7->_M_dataplus)._M_p,FORMAT_FASTQ_abi_cxx11_,sVar2), iVar6 != 0))
              )))) {
            _Var5 = std::operator==(psVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)FORMAT_JSON_abi_cxx11_);
            pCVar13 = this->m_settings;
            if (_Var5) {
              pcVar12 = PrintJson;
            }
            else {
              _Var5 = std::operator==(&pCVar13->Format,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&FORMAT_SAM_abi_cxx11_);
              pCVar13 = this->m_settings;
              if (_Var5) {
                pcVar12 = PrintSam;
              }
              else {
                _Var5 = std::operator==(&pCVar13->Format,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)FORMAT_YAML_abi_cxx11_);
                if (!_Var5) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"bamtools convert ERROR: unrecognized format: ",
                             0x2d);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cerr,
                                      (this->m_settings->Format)._M_dataplus._M_p,
                                      (this->m_settings->Format)._M_string_length);
                  std::endl<char,std::char_traits<char>>(poVar9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "Please see documentation for list of supported formats ",0x37);
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                  bVar4 = false;
                  goto LAB_00110e88;
                }
                pCVar13 = this->m_settings;
                pcVar12 = PrintYaml;
              }
            }
          }
          sVar2 = (pCVar13->Format)._M_string_length;
          if ((sVar2 == DAT_001b28f8) &&
             (((sVar2 == 0 ||
               (iVar6 = bcmp((pCVar13->Format)._M_dataplus._M_p,FORMAT_SAM_abi_cxx11_,sVar2),
               iVar6 == 0)) && (pCVar13->IsOmittingSamHeader == false)))) {
            BamMultiReader::GetHeaderText_abi_cxx11_(&local_390.Name,&local_3b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&this->m_out,local_390.Name._M_dataplus._M_p,local_390.Name._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_390.Name._M_dataplus._M_p != &local_390.Name.field_2) {
              operator_delete(local_390.Name._M_dataplus._M_p);
            }
          }
          BamAlignment::BamAlignment(&local_390);
          while (bVar4 = BamMultiReader::GetNextAlignment(&local_3b0,&local_390), bVar4) {
            (*pcVar12)(this,&local_390);
          }
          BamAlignment::~BamAlignment(&local_390);
          bVar4 = true;
        }
LAB_00110e88:
        BamMultiReader::Close(&local_3b0);
        if (this->m_settings->HasOutput == true) {
          std::ofstream::close();
        }
      }
      local_238._0_8_ = _VTT;
      *(undefined8 *)(local_238 + _VTT[-1].RefName.field_2._M_allocated_capacity) = _inflate;
      std::filebuf::~filebuf((filebuf *)(local_238 + 8));
      std::ios_base::~ios_base(local_140);
      goto LAB_00110ee0;
    }
    bVar4 = Utilities::ParseRegionString(&this->m_settings->Region,&local_3b0,&local_3a8);
    if (bVar4) {
      bVar4 = BamMultiReader::HasIndexes(&local_3b0);
      if ((!bVar4) || (bVar4 = BamMultiReader::SetRegion(&local_3b0,&local_3a8), bVar4))
      goto LAB_00110aa2;
      lVar10 = 0x54;
      pcVar11 = 
      "bamtools convert ERROR: set region failed. Check that REGION describes a valid range";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"bamtools convert ERROR: could not parse REGION: ",0x30);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->m_settings->Region)._M_dataplus._M_p,
                          (this->m_settings->Region)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      lVar10 = 0x5b;
      pcVar11 = 
      "Check that REGION is in valid format (see documentation) and that the coordinates are valid";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar10);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    BamMultiReader::Close(&local_3b0);
  }
  else {
    lVar10 = 0x45;
    pcVar11 = "bamtools convert ERROR: could not open input BAM file(s)... Aborting.";
LAB_00110b6d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar10);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  bVar4 = false;
LAB_00110ee0:
  BamMultiReader::~BamMultiReader(&local_3b0);
  return bVar4;
}

Assistant:

bool ConvertTool::ConvertToolPrivate::Run()
{

    // ------------------------------------
    // initialize conversion input/output

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist) {
        m_settings->InputFiles.push_back(Options::StandardIn());
    }

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools convert ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line)) {
            m_settings->InputFiles.push_back(line);
        }
    }

    // open input files
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools convert ERROR: could not open input BAM file(s)... Aborting."
                  << std::endl;
        return false;
    }

    // if input is not stdin & a region is provided, look for index files
    if (m_settings->HasInput && m_settings->HasRegion) {
        if (!reader.LocateIndexes()) {
            std::cerr << "bamtools convert ERROR: could not locate index file(s)... Aborting."
                      << std::endl;
            return false;
        }
    }

    // retrieve reference data
    m_references = reader.GetReferenceData();

    // set region if specified
    BamRegion region;
    if (m_settings->HasRegion) {
        if (Utilities::ParseRegionString(m_settings->Region, reader, region)) {

            if (reader.HasIndexes()) {
                if (!reader.SetRegion(region)) {
                    std::cerr << "bamtools convert ERROR: set region failed. Check that REGION "
                                 "describes a valid range"
                              << std::endl;
                    reader.Close();
                    return false;
                }
            }

        } else {
            std::cerr << "bamtools convert ERROR: could not parse REGION: " << m_settings->Region
                      << std::endl;
            std::cerr << "Check that REGION is in valid format (see documentation) and that the "
                         "coordinates are valid"
                      << std::endl;
            reader.Close();
            return false;
        }
    }

    // if output file given
    std::ofstream outFile;
    if (m_settings->HasOutput) {

        // open output file stream
        outFile.open(m_settings->OutputFilename.c_str());
        if (!outFile) {
            std::cerr << "bamtools convert ERROR: could not open " << m_settings->OutputFilename
                      << " for output" << std::endl;
            return false;
        }

        // set m_out to file's streambuf
        m_out.rdbuf(outFile.rdbuf());
    }

    // -------------------------------------
    // do conversion based on format

    bool convertedOk = true;

    // pileup is special case
    // conversion not done per alignment, like the other formats
    if (m_settings->Format == FORMAT_PILEUP) {
        convertedOk = RunPileupConversion(&reader);

        // all other formats
    } else {

        bool formatError = false;

        // set function pointer to proper conversion method
        void (BamTools::ConvertTool::ConvertToolPrivate::*pFunction)(const BamAlignment&) = 0;
        if (m_settings->Format == FORMAT_BED) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintBed;
        } else if (m_settings->Format == FORMAT_FASTA) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintFasta;
        } else if (m_settings->Format == FORMAT_FASTQ) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintFastq;
        } else if (m_settings->Format == FORMAT_JSON) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintJson;
        } else if (m_settings->Format == FORMAT_SAM) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintSam;
        } else if (m_settings->Format == FORMAT_YAML) {
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintYaml;
        } else {
            std::cerr << "bamtools convert ERROR: unrecognized format: " << m_settings->Format
                      << std::endl;
            std::cerr << "Please see documentation for list of supported formats " << std::endl;
            formatError = true;
            convertedOk = false;
        }

        // if format selected ok
        if (!formatError) {

            // if SAM format & not omitting header, print SAM header first
            if ((m_settings->Format == FORMAT_SAM) && !m_settings->IsOmittingSamHeader) {
                m_out << reader.GetHeaderText();
            }

            try {
                // iterate through file, doing conversion
                BamAlignment a;
                while (reader.GetNextAlignment(a)) {
                    (this->*pFunction)(a);
                }

                // set flag for successful conversion
                convertedOk = true;
            } catch (const BadDataException& e) {
                std::cerr << "Conversion failed : " << e.what() << '\n';

                convertedOk = false;
            }
        }
    }

    // ------------------------
    // clean up & exit
    reader.Close();
    if (m_settings->HasOutput) {
        outFile.close();
    }
    return convertedOk;
}